

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one_valus_inst.c
# Opt level: O1

void i64Ctz_op(vm *v,instruction *inst)

{
  uint64 uVar1;
  uint64 val;
  
  uVar1 = popU64(&v->operandStack);
  if (uVar1 == 0) {
    val = 0x40;
  }
  else {
    val = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> val & 1) == 0; val = val + 1) {
      }
    }
  }
  pushU64(&v->operandStack,val);
  return;
}

Assistant:

void i64Ctz_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    uint64 val = popU64(s);
    uint64 count = sizeof(uint64) * 8;
    while (val != 0) {
        val <<= 1;
        count--;
    }
    pushU64(s, count);
}